

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vector.h
# Opt level: O2

double __thiscall Nova::Vector<double,_3,_true>::Normalize(Vector<double,_3,_true> *this)

{
  double dVar1;
  Vector<double,_3,_true> data_copy;
  Vector<double,_3,_true> local_28;
  
  dVar1 = Norm(this);
  if ((dVar1 != 0.0) || (NAN(dVar1))) {
    local_28._data._M_elems[2] = (this->_data)._M_elems[2];
    local_28._data._M_elems[0] = (this->_data)._M_elems[0];
    local_28._data._M_elems[1] = (this->_data)._M_elems[1];
    operator*=(&local_28,1.0 / dVar1);
    (this->_data)._M_elems[0] = local_28._data._M_elems[0];
    (this->_data)._M_elems[1] = local_28._data._M_elems[1];
    (this->_data)._M_elems[2] = local_28._data._M_elems[2];
  }
  else {
    Axis_Vector(&local_28,0);
    (this->_data)._M_elems[2] = local_28._data._M_elems[2];
    (this->_data)._M_elems[0] = local_28._data._M_elems[0];
    (this->_data)._M_elems[1] = local_28._data._M_elems[1];
  }
  return dVar1;
}

Assistant:

T Normalize()
    {
        T norm=Norm();
        if(norm) *this=this->operator*((T)1./norm);
        else *this=Axis_Vector(0);
        return norm;
    }